

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeMemoryReporterTest.cpp
# Opt level: O2

void __thiscall
TEST_CodeMemoryReportFormatter_twoMallocAndTwoFree_Test::
TEST_CodeMemoryReportFormatter_twoMallocAndTwoFree_Test
          (TEST_CodeMemoryReportFormatter_twoMallocAndTwoFree_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).testResult = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).formatter =
       (CodeMemoryReportFormatter *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).testOutput.output.buffer_ =
       (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).testOutput.output.bufferSize_ = 0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).testOutput.super_TestOutput.
    color_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).testOutput.super_TestOutput.
  progressIndication_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).testOutput.super_TestOutput.
  _vptr_TestOutput = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).testOutput.super_TestOutput.
  dotCount_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).testOutput.super_TestOutput.
  verbose_ = level_quiet;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).memory01 = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).memory02 = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).newAllocator =
       (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).newArrayAllocator =
       (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).cAllocator =
       (TestMemoryAllocator *)0x0;
  TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter::
  TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter
            (&this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter);
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter_002c75a8;
  return;
}

Assistant:

TEST(CodeMemoryReportFormatter, twoMallocAndTwoFree)
{
    formatter->report_alloc_memory(testResult, cAllocator, 10, memory01, "file", 2);
    formatter->report_alloc_memory(testResult, cAllocator, 10, memory02, "boo", 4);
    testOutput.flush();
    formatter->report_free_memory(testResult, cAllocator, memory01, "foo", 6);
    formatter->report_free_memory(testResult, cAllocator, memory02, "bar", 8);
    TESTOUTPUT_CONTAINS("\tfree(file_2_1); /* at foo:6 */\n");
    TESTOUTPUT_CONTAINS("\tfree(boo_4_1); /* at bar:8 */\n");
}